

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv6Transmitter::LeaveAllMulticastGroups(RTPUDPv6Transmitter *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  HashElement *pHVar3;
  ipv6_mreq mreq;
  in6_addr mcastIP;
  
  if (this->init == true) {
    if (this->created == true) {
      pHVar3 = (this->multicastgroups).firsthashelem;
      (this->multicastgroups).curhashelem = pHVar3;
      while (pHVar3 != (HashElement *)0x0) {
        uVar1 = *(undefined8 *)&(pHVar3->element).__in6_u;
        uVar2 = *(undefined8 *)((long)&(pHVar3->element).__in6_u + 8);
        mreq.ipv6mr_interface = this->mcastifidx;
        mreq.ipv6mr_multiaddr.__in6_u._0_8_ = uVar1;
        mreq.ipv6mr_multiaddr.__in6_u._8_8_ = uVar2;
        setsockopt(this->rtpsock,0x29,0x15,&mreq,0x14);
        mreq.ipv6mr_interface = this->mcastifidx;
        mreq.ipv6mr_multiaddr.__in6_u._0_8_ = uVar1;
        mreq.ipv6mr_multiaddr.__in6_u._8_8_ = uVar2;
        setsockopt(this->rtcpsock,0x29,0x15,&mreq,0x14);
        pHVar3 = (this->multicastgroups).curhashelem;
        if (pHVar3 == (HashElement *)0x0) {
          pHVar3 = (HashElement *)0x0;
        }
        else {
          pHVar3 = pHVar3->listnext;
          (this->multicastgroups).curhashelem = pHVar3;
        }
      }
      RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::Clear
                (&this->multicastgroups);
    }
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			in6_addr mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.GotoNextElement();
			JRTPLIB_UNUSED(status);
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}